

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txt_to_cpp.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  int local_438;
  int local_434;
  int c;
  int i;
  long local_420;
  ifstream fi;
  long local_218;
  ofstream fo;
  char **argv_local;
  int argc_local;
  
  if (argc == 4) {
    std::ofstream::ofstream(&local_218,argv[1],0x10);
    std::ifstream::ifstream(&local_420,argv[2],8);
    bVar1 = std::ios::operator!((ios *)((long)&local_420 + *(long *)(local_420 + -0x18)));
    if (((bVar1 & 1) == 0) &&
       (bVar1 = std::ios::operator!((ios *)((long)&local_218 + *(long *)(local_218 + -0x18))),
       (bVar1 & 1) == 0)) {
      poVar2 = std::operator<<((ostream *)&local_218,"char ");
      poVar2 = std::operator<<(poVar2,argv[3]);
      std::operator<<(poVar2,"[] = {");
      local_434 = 0;
      while( true ) {
        local_438 = std::istream::get();
        bVar1 = std::ios::eof();
        if ((bVar1 & 1) != 0) {
          local_438 = 0;
        }
        if (local_434 != 0) {
          std::operator<<((ostream *)&local_218,", ");
        }
        if (local_434 % 0x10 == 0) {
          std::operator<<((ostream *)&local_218,"\n    ");
        }
        std::ostream::operator<<((ostream *)&local_218,local_438);
        bVar1 = std::ios::eof();
        if ((bVar1 & 1) != 0) break;
        local_434 = local_434 + 1;
      }
      if (local_434 != 0) {
        std::operator<<((ostream *)&local_218,"\n");
      }
      std::operator<<((ostream *)&local_218,"};\n");
      argv_local._4_4_ = 0;
    }
    else {
      argv_local._4_4_ = 2;
    }
    std::ifstream::~ifstream(&local_420);
    std::ofstream::~ofstream(&local_218);
  }
  else {
    argv_local._4_4_ = usage(*argv,"nb args",1);
  }
  return argv_local._4_4_;
}

Assistant:

int main( int argc, char **argv ) {
    if ( argc != 4 )
        return usage( argv[ 0 ], "nb args", 1 );
    std::ofstream fo( argv[ 1 ] );
    std::ifstream fi( argv[ 2 ] );
    if ( not fi or not fo )
        return 2;

    fo << "char " << argv[ 3 ] << "[] = {";
    for( int i = 0; ; ++i ) {
        int c = fi.get();
        if ( fi.eof() )
            c = 0;

        if ( i )
            fo << ", ";
        if ( i % 16 == 0 )
            fo << "\n    ";
        fo << c;

        if ( fi.eof() ) {
            if ( i )
                fo << "\n";
            break;
        }
    }
    fo << "};\n";

    return 0;
}